

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O1

ssize_t __thiscall
blc::tools::VFile::read_abi_cxx11_(VFile *this,int __fd,void *__buf,size_t __nbytes)

{
  exception *peVar1;
  undefined4 in_register_00000034;
  long lVar2;
  string *tmp;
  string local_68;
  string local_48;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  if (*(char *)(lVar2 + 0x260) != '\0') {
    peVar1 = (exception *)__cxa_allocate_exception(0x78);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Attempt to read a closed virtual file","");
    error::exception::exception(peVar1,&local_68);
    __cxa_throw(peVar1,&error::exception::typeinfo,error::exception::~exception);
  }
  if ((ulong)(long)*(int *)(lVar2 + 0x238) <= *(ulong *)(lVar2 + 0x220)) {
    std::__cxx11::string::find((char)(lVar2 + 0x218U),10);
    std::__cxx11::string::substr((ulong)this,lVar2 + 0x218U);
    *(int *)(lVar2 + 0x238) = *(int *)&this->_file + *(int *)(lVar2 + 0x238) + 1;
    return (ssize_t)this;
  }
  peVar1 = (exception *)__cxa_allocate_exception(0x78);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Cursor exeeds the size of file","");
  error::exception::exception(peVar1,&local_48);
  __cxa_throw(peVar1,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

std::string blc::tools::VFile::read() const {
	if (!this->_isClosed) {
		if (this->_cursor <= this->_cache.size()) {
			std::string tmp = this->_cache.substr(this->_cursor, this->_cache.find_first_of('\n', this->_cursor) - this->_cursor);
			( const_cast <VFile*> (this) )->_cursor += tmp.size() + 1;
			return tmp;
		} else {
			throw blc::error::exception("Cursor exeeds the size of file");
		}
	} else {
		throw blc::error::exception("Attempt to read a closed virtual file");
	}
}